

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool __thiscall
bssl::hkdf_extract_to_secret
          (bssl *this,SSL_HANDSHAKE *hs,SSLTranscript *transcript,Span<const_unsigned_char> in)

{
  int iVar1;
  uchar *out_key;
  EVP_MD *digest;
  uchar *secret;
  size_t sVar2;
  uchar *salt;
  size_t salt_len;
  size_t local_38;
  size_t len;
  SSLTranscript *transcript_local;
  SSL_HANDSHAKE *hs_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = in.data_;
  len = (size_t)hs;
  transcript_local = (SSLTranscript *)this;
  hs_local = (SSL_HANDSHAKE *)transcript;
  out_key = InplaceVector<unsigned_char,_64UL>::data
                      ((InplaceVector<unsigned_char,_64UL> *)(this + 0x20));
  digest = SSLTranscript::Digest((SSLTranscript *)len);
  secret = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&hs_local);
  sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&hs_local);
  salt = InplaceVector<unsigned_char,_64UL>::data
                   ((InplaceVector<unsigned_char,_64UL> *)&(transcript_local->hash_).ctx_.pctx_ops);
  salt_len = InplaceVector<unsigned_char,_64UL>::size
                       ((InplaceVector<unsigned_char,_64UL> *)
                        &(transcript_local->hash_).ctx_.pctx_ops);
  iVar1 = HKDF_extract(out_key,&local_38,digest,secret,sVar2,salt,salt_len);
  if (iVar1 == 0) {
    in_local.size_._7_1_ = false;
  }
  else {
    sVar2 = InplaceVector<unsigned_char,_64UL>::size
                      ((InplaceVector<unsigned_char,_64UL> *)
                       &(transcript_local->hash_).ctx_.pctx_ops);
    if (local_38 != sVar2) {
      __assert_fail("len == hs->secret.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                    ,0x3c,
                    "bool bssl::hkdf_extract_to_secret(SSL_HANDSHAKE *, const SSLTranscript &, Span<const uint8_t>)"
                   );
    }
    in_local.size_._7_1_ = true;
  }
  return in_local.size_._7_1_;
}

Assistant:

static bool hkdf_extract_to_secret(SSL_HANDSHAKE *hs,
                                   const SSLTranscript &transcript,
                                   Span<const uint8_t> in) {
  size_t len;
  if (!HKDF_extract(hs->secret.data(), &len, transcript.Digest(), in.data(),
                    in.size(), hs->secret.data(), hs->secret.size())) {
    return false;
  }
  assert(len == hs->secret.size());
  return true;
}